

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::jacobiSVD<float>
               (Matrix44<float> *A,Matrix44<float> *U,Vec4<float> *S,Matrix44<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int i_2;
  float (*pafVar7) [4];
  long lVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  uint uVar16;
  float *pfVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vec4<float> uCol;
  float local_a8 [4];
  float local_98 [4];
  float *local_88;
  float *local_80;
  Matrix44<float> local_78;
  
  pafVar7 = (float (*) [4])&local_78;
  local_78.x[0][0] = A->x[0][0];
  local_78.x[0][1] = A->x[0][1];
  local_78.x[0][2] = A->x[0][2];
  local_78.x[0][3] = A->x[0][3];
  local_78.x[1][0] = A->x[1][0];
  local_78.x[1][1] = A->x[1][1];
  local_78.x[1][2] = A->x[1][2];
  local_78.x[1][3] = A->x[1][3];
  local_78.x[2][0] = A->x[2][0];
  local_78.x[2][1] = A->x[2][1];
  local_78.x[2][2] = A->x[2][2];
  local_78.x[2][3] = A->x[2][3];
  local_78.x[3][0] = A->x[3][0];
  local_78.x[3][1] = A->x[3][1];
  local_78.x[3][2] = A->x[3][2];
  local_78.x[3][3] = A->x[3][3];
  U->x[0][0] = 1.0;
  pfVar17 = U->x[0] + 1;
  *(float *)((long)(U->x + 0) + 4) = 0.0;
  *(float *)((long)(U->x + 0) + 8) = 0.0;
  *(undefined8 *)(U->x[0] + 3) = 0;
  U->x[1][1] = 1.0;
  *(float *)((long)(U->x + 1) + 8) = 0.0;
  *(float *)((long)(U->x + 1) + 0xc) = 0.0;
  *(float *)((long)(U->x + 2) + 0) = 0.0;
  *(float *)((long)(U->x + 2) + 4) = 0.0;
  U->x[2][2] = 1.0;
  *(undefined8 *)(U->x[2] + 3) = 0;
  *(float *)((long)(U->x + 3) + 4) = 0.0;
  *(float *)((long)(U->x + 3) + 8) = 0.0;
  U->x[3][3] = 1.0;
  V->x[0][0] = 1.0;
  pfVar18 = V->x[0] + 1;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(float *)((long)(V->x + 0) + 8) = 0.0;
  *(undefined8 *)(V->x[0] + 3) = 0;
  V->x[1][1] = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 1) + 0xc) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  *(undefined8 *)(V->x[2] + 3) = 0;
  *(float *)((long)(V->x + 3) + 4) = 0.0;
  *(float *)((long)(V->x + 3) + 8) = 0.0;
  V->x[3][3] = 1.0;
  fVar21 = 0.0;
  lVar8 = 0;
  do {
    lVar10 = 0;
    fVar19 = fVar21;
    do {
      fVar21 = fVar19;
      if ((lVar8 != lVar10) && (fVar21 = ABS((*(float (*) [4])*pafVar7)[lVar10]), fVar21 <= fVar19))
      {
        fVar21 = fVar19;
      }
      lVar10 = lVar10 + 1;
      fVar19 = fVar21;
    } while (lVar10 != 4);
    lVar8 = lVar8 + 1;
    pafVar7 = pafVar7 + 1;
  } while (lVar8 != 4);
  fVar21 = fVar21 * tol;
  if ((fVar21 != 0.0) || (NAN(fVar21))) {
    uVar16 = 0;
    local_88 = pfVar18;
    local_80 = pfVar17;
    while( true ) {
      bVar1 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,0,1,U,V,tol);
      bVar2 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,0,2,U,V,tol);
      bVar3 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,0,3,U,V,tol);
      bVar4 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,1,2,U,V,tol);
      bVar5 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,1,3,U,V,tol);
      bVar6 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,2,3,U,V,tol);
      pfVar17 = local_80;
      pfVar18 = local_88;
      if (((((!bVar6) && (!bVar5)) && (!bVar4)) && ((!bVar3 && (!bVar1)))) && (!bVar2)) break;
      fVar19 = 0.0;
      pafVar7 = (float (*) [4])&local_78;
      lVar8 = 0;
      do {
        lVar10 = 0;
        fVar20 = fVar19;
        do {
          fVar19 = fVar20;
          if ((lVar8 != lVar10) &&
             (fVar19 = ABS((*(float (*) [4])*pafVar7)[lVar10]), fVar19 <= fVar20)) {
            fVar19 = fVar20;
          }
          lVar10 = lVar10 + 1;
          fVar20 = fVar19;
        } while (lVar10 != 4);
        lVar8 = lVar8 + 1;
        pafVar7 = pafVar7 + 1;
      } while (lVar8 != 4);
      if ((fVar19 <= fVar21) || (bVar1 = 0x12 < uVar16, uVar16 = uVar16 + 1, bVar1)) break;
    }
  }
  S->x = local_78.x[0][0];
  S->y = local_78.x[1][1];
  S->z = local_78.x[2][2];
  S->w = local_78.x[3][3];
  lVar8 = 0;
  pfVar9 = (float *)U;
  do {
    if ((&S->x)[lVar8] < 0.0) {
      (&S->x)[lVar8] = -(&S->x)[lVar8];
      lVar10 = 0;
      do {
        *(uint *)((long)pfVar9 + lVar10) = *(uint *)((long)pfVar9 + lVar10) ^ 0x80000000;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
    }
    lVar8 = lVar8 + 1;
    pfVar9 = pfVar9 + 1;
  } while (lVar8 != 4);
  lVar8 = 1;
  lVar10 = 0;
  pfVar9 = pfVar18;
  pfVar11 = pfVar17;
  do {
    local_98[0] = U->x[0][lVar8];
    local_98[1] = U->x[1][lVar8];
    local_98[2] = U->x[2][lVar8];
    local_98[3] = U->x[3][lVar8];
    local_a8[0] = V->x[0][lVar8];
    local_a8[1] = V->x[1][lVar8];
    local_a8[2] = V->x[2][lVar8];
    local_a8[3] = V->x[3][lVar8];
    fVar21 = (&S->x)[lVar8];
    lVar12 = lVar10;
    pfVar13 = pfVar11;
    pfVar15 = pfVar9;
    do {
      if (ABS(fVar21) <= ABS((&S->x)[lVar12])) goto LAB_00105f3d;
      lVar14 = 0;
      do {
        *(undefined4 *)((long)pfVar13 + lVar14) = *(undefined4 *)((long)pfVar13 + lVar14 + -4);
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        *(undefined4 *)((long)pfVar15 + lVar14) = *(undefined4 *)((long)pfVar15 + lVar14 + -4);
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      (&S->y)[lVar12] = (&S->x)[lVar12];
      pfVar13 = pfVar13 + -1;
      pfVar15 = pfVar15 + -1;
      bVar1 = 0 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar1);
    lVar12 = -1;
LAB_00105f3d:
    lVar12 = (long)(int)lVar12;
    lVar14 = 0;
    do {
      pfVar17[lVar12 + lVar14] = *(float *)((long)local_98 + lVar14);
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x10);
    lVar14 = 0;
    do {
      pfVar18[lVar12 + lVar14] = *(float *)((long)local_a8 + lVar14);
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x10);
    (&S->y)[lVar12] = fVar21;
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 1;
    pfVar11 = pfVar11 + 1;
    pfVar9 = pfVar9 + 1;
    if (lVar10 == 3) {
      if (forcePositiveDeterminant) {
        fVar21 = Matrix44<float>::determinant(U);
        if (fVar21 < 0.0) {
          lVar8 = 0;
          do {
            *(uint *)((long)U->x[0] + lVar8 + 0xc) =
                 *(uint *)((long)U->x[0] + lVar8 + 0xc) ^ 0x80000000;
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x40);
          S->w = -S->w;
        }
        fVar21 = Matrix44<float>::determinant(V);
        if (fVar21 < 0.0) {
          lVar8 = 0;
          do {
            *(uint *)((long)V->x[0] + lVar8 + 0xc) =
                 *(uint *)((long)V->x[0] + lVar8 + 0xc) ^ 0x80000000;
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x40);
          S->w = -S->w;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}